

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

Matrix4f *
Matrix4f::perspectiveProjection
          (Matrix4f *__return_storage_ptr__,float fLeft,float fRight,float fBottom,float fTop,
          float fZNear,float fZFar,bool directX)

{
  undefined3 in_register_00000031;
  Matrix4f *projection;
  float fVar1;
  float in_XMM0_Db;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float in_XMM1_Db;
  float in_XMM2_Db;
  float in_XMM3_Db;
  float fVar5;
  
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = 0.0;
  __return_storage_ptr__->m_elements[9] = 0.0;
  __return_storage_ptr__->m_elements[10] = 0.0;
  __return_storage_ptr__->m_elements[0xb] = 0.0;
  __return_storage_ptr__->m_elements[0xc] = 0.0;
  __return_storage_ptr__->m_elements[0xc] = 0.0;
  __return_storage_ptr__->m_elements[0xd] = 0.0;
  __return_storage_ptr__->m_elements[0xe] = 0.0;
  __return_storage_ptr__->m_elements[0xf] = 0.0;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = 0.0;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 0.0;
  fVar5 = fZNear + fZNear;
  __return_storage_ptr__->m_elements[0] = fVar5 / (fRight - fLeft);
  auVar2._0_4_ = fLeft + fRight;
  auVar2._4_4_ = fBottom + fTop;
  auVar2._8_4_ = in_XMM0_Db + in_XMM1_Db;
  auVar2._12_4_ = in_XMM2_Db + in_XMM3_Db;
  auVar3._4_4_ = fTop - fBottom;
  auVar3._0_4_ = fRight - fLeft;
  auVar3._8_4_ = in_XMM1_Db - in_XMM0_Db;
  auVar3._12_4_ = in_XMM3_Db - in_XMM2_Db;
  auVar3 = divps(auVar2,auVar3);
  __return_storage_ptr__->m_elements[5] = fVar5 / (fTop - fBottom);
  *(long *)(__return_storage_ptr__->m_elements + 8) = auVar3._0_8_;
  __return_storage_ptr__->m_elements[0xb] = -1.0;
  fVar4 = fZNear;
  fVar1 = fZFar;
  if (CONCAT31(in_register_00000031,directX) == 0) {
    fVar1 = fZNear + fZFar;
    fVar4 = fVar5;
  }
  __return_storage_ptr__->m_elements[10] = fVar1 / (fZNear - fZFar);
  __return_storage_ptr__->m_elements[0xe] = (fVar4 * fZFar) / (fZNear - fZFar);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::perspectiveProjection( float fLeft, float fRight,
										 float fBottom, float fTop,
										 float fZNear, float fZFar,
										 bool directX )
{
	Matrix4f projection; // zero matrix

	projection( 0, 0 ) = ( 2.0f * fZNear ) / ( fRight - fLeft );
	projection( 1, 1 ) = ( 2.0f * fZNear ) / ( fTop - fBottom );
	projection( 0, 2 ) = ( fRight + fLeft ) / ( fRight - fLeft );
	projection( 1, 2 ) = ( fTop + fBottom ) / ( fTop - fBottom );
	projection( 3, 2 ) = -1;

	if( directX )
	{
		projection( 2, 2 ) = fZFar / ( fZNear - fZFar);
		projection( 2, 3 ) = ( fZNear * fZFar ) / ( fZNear - fZFar );
	}
	else
	{
		projection( 2, 2 ) = ( fZNear + fZFar ) / ( fZNear - fZFar );
		projection( 2, 3 ) = ( 2.0f * fZNear * fZFar ) / ( fZNear - fZFar );
	}

	return projection;
}